

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O1

bool __thiscall
crnlib::mipmapped_texture::read_crn_from_memory
          (mipmapped_texture *this,void *pData,uint data_size,char *pFilename)

{
  element *p;
  void *p_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  mip_level *pmVar4;
  crnd_unpack_context pvVar5;
  dxt_image *this_00;
  uint32 row_pitch_in_bytes;
  uint uVar6;
  vector<crnlib::mip_level_*> *pvVar7;
  ulong uVar8;
  byte bVar9;
  uint uVar10;
  char *pcVar11;
  ulong uVar12;
  dynamic_string *pdVar13;
  ulong uVar14;
  mipmapped_texture *this_01;
  long lVar15;
  face_vec faces;
  vector<unsigned_char> dxt_data;
  void *pFaces [6];
  uint local_110;
  face_vec local_108;
  elemental_vector local_f8;
  crnd_unpack_context local_e0;
  undefined4 local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  int local_c4;
  crn_format local_b8;
  char *local_b0;
  uint local_a8;
  pixel_format local_a4;
  mipmapped_texture *local_a0;
  dynamic_string *local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  dynamic_string local_78;
  void *local_68 [7];
  
  pcVar11 = pFilename;
  clear(this);
  pdVar13 = &this->m_last_error;
  dynamic_string::set(pdVar13,"Image file load failed",0xffffffff);
  if (data_size != 0 && pData != (void *)0x0) {
    local_d8 = 0x28;
    bVar1 = crnd::crnd_get_texture_info
                      ((crnd *)pData,(void *)(ulong)data_size,(uint32)&local_d8,
                       (crn_texture_info *)
                       CONCAT71((int7)((ulong)pcVar11 >> 8),data_size == 0 || pData == (void *)0x0))
    ;
    if (bVar1) {
      local_a4 = crnd::crnd_crn_format_to_fourcc(local_b8);
      uVar6 = local_c8;
      if ((int)local_a4 < 0x35545844) {
        if ((int)local_a4 < 0x32435445) {
          if ((int)local_a4 < 0x31495441) {
            if (local_a4 == PIXEL_FMT_INVALID) {
              pcVar11 = "Unsupported DXT format";
              local_a4 = 0;
              goto LAB_001343ff;
            }
            if (local_a4 != PIXEL_FMT_ETC1) goto LAB_0013457a;
            local_110 = 7;
          }
          else if (local_a4 == PIXEL_FMT_DXT5A) {
            local_110 = 4;
          }
          else {
            local_110 = 0;
            if (local_a4 != PIXEL_FMT_DXT1) goto LAB_0013457a;
          }
        }
        else if ((int)local_a4 < 0x32545844) {
          if (local_a4 == PIXEL_FMT_ETC2) {
            local_110 = 8;
          }
          else {
            if (local_a4 != PIXEL_FMT_3DC) goto LAB_0013457a;
            local_110 = 6;
          }
        }
        else if ((local_a4 == PIXEL_FMT_DXT2) || (local_a4 == PIXEL_FMT_DXT3)) {
          local_110 = 2;
        }
        else {
          if (local_a4 == PIXEL_FMT_DXT4) goto LAB_00134528;
LAB_0013457a:
          local_110 = 0xffffffff;
        }
      }
      else if ((int)local_a4 < 0x52784778) {
        if ((int)local_a4 < 0x41325445) {
          if (local_a4 == PIXEL_FMT_DXT5) goto LAB_00134528;
          if (local_a4 != PIXEL_FMT_DXT1A) goto LAB_0013457a;
          local_110 = 1;
        }
        else if (local_a4 == PIXEL_FMT_ETC2A) {
          local_110 = 9;
        }
        else {
          if ((local_a4 != PIXEL_FMT_DXT5_AGBR) && (local_a4 != PIXEL_FMT_DXT5_xGBR))
          goto LAB_0013457a;
LAB_00134528:
          local_110 = 3;
        }
      }
      else if ((int)local_a4 < 0x53413245) {
        if (local_a4 == PIXEL_FMT_DXT5_xGxR) goto LAB_00134528;
        if (local_a4 != PIXEL_FMT_ETC1S) goto LAB_0013457a;
        local_110 = 10;
      }
      else if (local_a4 == PIXEL_FMT_ETC2AS) {
        local_110 = 0xb;
      }
      else {
        if (local_a4 != PIXEL_FMT_DXN) {
          if (local_a4 != PIXEL_FMT_DXT5_CCxY) goto LAB_0013457a;
          goto LAB_00134528;
        }
        local_110 = 5;
      }
      local_108.m_p = (vector<crnlib::mip_level_*> *)0x0;
      local_108.m_size = 0;
      local_108.m_capacity = 0;
      local_b0 = pFilename;
      if (local_c8 != 0) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&local_108,local_c8,local_c8 == 1,0x10,(object_mover)0x0,
                   false);
        if (uVar6 != local_108.m_size) {
          memset(local_108.m_p + (local_108._8_8_ & 0xffffffff),0,
                 (ulong)(uVar6 - local_108.m_size) << 4);
        }
        local_108.m_size = uVar6;
      }
      local_a0 = this;
      local_98 = pdVar13;
      if (local_c8 != 0) {
        uVar14 = 0;
        do {
          uVar10 = local_cc;
          uVar2 = local_108.m_p[uVar14].m_size;
          pvVar7 = local_108.m_p + uVar14;
          if (uVar2 != local_cc) {
            if (uVar2 <= local_cc) {
              if (pvVar7->m_capacity < local_cc) {
                elemental_vector::increase_capacity
                          ((elemental_vector *)pvVar7,local_cc,uVar2 + 1 == local_cc,8,
                           (object_mover)0x0,false);
              }
              memset(pvVar7->m_p + pvVar7->m_size,0,(ulong)(uVar10 - pvVar7->m_size) << 3);
            }
            pvVar7->m_size = uVar10;
          }
          if (local_cc != 0) {
            uVar8 = 0;
            do {
              pmVar4 = (mip_level *)crnlib_malloc(0x28);
              pmVar4->m_width = 0;
              pmVar4->m_height = 0;
              pmVar4->m_comp_flags = cDefaultCompFlags;
              *(undefined8 *)&pmVar4->m_format = 0;
              *(undefined8 *)((long)&pmVar4->m_pImage + 4) = 0;
              *(undefined8 *)((long)&pmVar4->m_pDXTImage + 4) = 0;
              local_108.m_p[uVar14].m_p[uVar8] = pmVar4;
              uVar8 = uVar8 + 1;
            } while (uVar8 < local_cc);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 < local_c8);
      }
      pdVar13 = local_98;
      this_01 = local_a0;
      pcVar11 = local_b0;
      local_f8.m_p = (void *)0x0;
      local_f8.m_size = 0;
      local_f8.m_capacity = 0;
      uVar6 = (local_d0 + 3 >> 2) * (local_d4 + 3 >> 2) * local_c8 * local_c4;
      if (uVar6 != 0) {
        if (uVar6 != 0) {
          elemental_vector::increase_capacity(&local_f8,uVar6,uVar6 == 1,1,(object_mover)0x0,false);
        }
        memset((void *)((local_f8._8_8_ & 0xffffffff) + (long)local_f8.m_p),0,
               (ulong)(uVar6 - local_f8.m_size));
        local_f8.m_size = uVar6;
      }
      dynamic_string::set(pdVar13,"CRN unpack failed",0xffffffff);
      pvVar5 = crnd::crnd_unpack_begin(pData,data_size);
      if (pvVar5 == (crnd_unpack_context)0x0) {
        if (local_108.m_size != 0) {
          uVar14 = 0;
          do {
            if (local_108.m_p[uVar14].m_size != 0) {
              uVar8 = 0;
              do {
                pmVar4 = local_108.m_p[uVar14].m_p[uVar8];
                if (pmVar4 != (mip_level *)0x0) {
                  mip_level::~mip_level(pmVar4);
                  crnlib_free(pmVar4);
                }
                uVar8 = uVar8 + 1;
              } while (uVar8 < local_108.m_p[uVar14].m_size);
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 < (local_108._8_8_ & 0xffffffff));
        }
        uVar14 = 0;
      }
      else {
        if ((ulong)local_c8 < 6) {
          memset(local_68 + local_c8,0,(ulong)(5 - local_c8) * 8 + 8);
        }
        uVar14 = (ulong)CONCAT31((int3)(data_size >> 8),local_cc == 0);
        local_e0 = pvVar5;
        if (local_cc != 0) {
          uVar8 = 0;
          do {
            uVar2 = local_d4 >> ((byte)uVar8 & 0x1f);
            uVar2 = uVar2 + (uVar2 == 0);
            local_80 = (ulong)uVar2;
            uVar10 = local_d0 >> ((byte)uVar8 & 0x1f);
            uVar10 = uVar10 + (uVar10 == 0);
            local_88 = (ulong)uVar10;
            row_pitch_in_bytes = local_c4 * (uVar2 + 3 >> 2);
            if ((ulong)local_c8 != 0) {
              uVar2 = 0;
              uVar12 = 0;
              do {
                local_68[uVar12] = (void *)((ulong)uVar2 + (long)local_f8.m_p);
                uVar12 = uVar12 + 1;
                uVar2 = uVar2 + row_pitch_in_bytes * (uVar10 + 3 >> 2);
              } while (local_c8 != uVar12);
            }
            bVar1 = crnd::crnd_unpack_level
                              (local_e0,local_68,local_f8.m_size,row_pitch_in_bytes,(uint32)uVar8);
            if (!bVar1) {
              crnd::crnd_unpack_end(local_e0);
              if (local_108.m_size != 0) {
                uVar8 = 0;
                do {
                  if (local_108.m_p[uVar8].m_size != 0) {
                    uVar12 = 0;
                    do {
                      pmVar4 = local_108.m_p[uVar8].m_p[uVar12];
                      if (pmVar4 != (mip_level *)0x0) {
                        mip_level::~mip_level(pmVar4);
                        crnlib_free(pmVar4);
                      }
                      uVar12 = uVar12 + 1;
                    } while (uVar12 < local_108.m_p[uVar8].m_size);
                  }
                  uVar8 = uVar8 + 1;
                } while (uVar8 < (local_108._8_8_ & 0xffffffff));
              }
              goto LAB_00134a7e;
            }
            local_a8 = (uint)uVar14;
            local_90 = uVar8;
            if (local_c8 != 0) {
              uVar8 = 0;
              do {
                this_00 = (dxt_image *)crnlib_malloc(0x48);
                dxt_image::dxt_image(this_00);
                iVar3 = dxt_image::init(this_00,(EVP_PKEY_CTX *)(ulong)local_110);
                if ((char)iVar3 == '\0') {
                  p = (this_00->m_elements).m_p;
                  if (p != (element *)0x0) {
                    crnlib_free(p);
                  }
                  crnlib_free(this_00);
                  crnd::crnd_unpack_end(local_e0);
                  if (local_108.m_size != 0) {
                    uVar14 = 0;
                    do {
                      if (local_108.m_p[uVar14].m_size != 0) {
                        uVar12 = 0;
                        do {
                          pmVar4 = local_108.m_p[uVar14].m_p[uVar12];
                          if (pmVar4 != (mip_level *)0x0) {
                            mip_level::~mip_level(pmVar4);
                            crnlib_free(pmVar4);
                          }
                          uVar12 = uVar12 + 1;
                        } while (uVar12 < local_108.m_p[uVar14].m_size);
                      }
                      uVar14 = uVar14 + 1;
                    } while (uVar14 < (local_108._8_8_ & 0xffffffff));
                  }
                }
                else {
                  mip_level::assign(local_108.m_p[uVar8].m_p[local_90],this_00,local_a4,
                                    cDefaultOrientationFlags);
                }
                if ((char)iVar3 == '\0') {
                  uVar14 = (ulong)local_a8;
                  goto LAB_00134a7e;
                }
                uVar8 = uVar8 + 1;
              } while (uVar8 < local_c8);
            }
            uVar8 = local_90 + 1;
            uVar14 = CONCAT71((int7)(uVar14 >> 8),uVar8 >= local_cc);
            pdVar13 = local_98;
            this_01 = local_a0;
            pcVar11 = local_b0;
          } while (uVar8 < local_cc);
        }
        crnd::crnd_unpack_end(local_e0);
        assign(this_01,&local_108);
        dynamic_string::dynamic_string(&local_78,pcVar11);
        dynamic_string::set(&this_01->m_name,&local_78,0xffffffff);
        if ((local_78.m_pStr != (char *)0x0) &&
           ((*(uint *)(local_78.m_pStr + -8) ^ *(uint *)(local_78.m_pStr + -4)) == 0xffffffff)) {
          crnlib_free(local_78.m_pStr + -0x10);
        }
        this_01->m_source_file_type = cFormatCRN;
        dynamic_string::clear(pdVar13);
      }
LAB_00134a7e:
      bVar9 = (byte)uVar14;
      if (local_f8.m_p != (void *)0x0) {
        crnlib_free(local_f8.m_p);
      }
      pvVar7 = local_108.m_p;
      if (local_108.m_p != (vector<crnlib::mip_level_*> *)0x0) {
        uVar14 = local_108._8_8_ & 0xffffffff;
        if (uVar14 != 0) {
          lVar15 = 0;
          do {
            p_00 = *(void **)((long)&pvVar7->m_p + lVar15);
            if (p_00 != (void *)0x0) {
              crnlib_free(p_00);
            }
            lVar15 = lVar15 + 0x10;
          } while (uVar14 << 4 != lVar15);
        }
        crnlib_free(local_108.m_p);
      }
      goto LAB_0013440e;
    }
    pcVar11 = "crnd_get_texture_info() failed";
LAB_001343ff:
    dynamic_string::set(pdVar13,pcVar11,0xffffffff);
  }
  bVar9 = 0;
LAB_0013440e:
  return (bool)(bVar9 & 1);
}

Assistant:

bool mipmapped_texture::read_crn_from_memory(const void* pData, uint data_size, const char* pFilename) {
  clear();

  set_last_error("Image file load failed");

  if ((!pData) || (data_size < 1))
    return false;

  crnd::crn_texture_info tex_info;
  tex_info.m_struct_size = sizeof(crnd::crn_texture_info);
  if (!crnd_get_texture_info(pData, data_size, &tex_info)) {
    set_last_error("crnd_get_texture_info() failed");
    return false;
  }

  const pixel_format dds_fmt = (pixel_format)crnd::crnd_crn_format_to_fourcc(tex_info.m_format);
  if (dds_fmt == PIXEL_FMT_INVALID) {
    set_last_error("Unsupported DXT format");
    return false;
  }

  const dxt_format dxt_fmt = pixel_format_helpers::get_dxt_format(dds_fmt);

  face_vec faces(tex_info.m_faces);
  for (uint f = 0; f < tex_info.m_faces; f++) {
    faces[f].resize(tex_info.m_levels);

    for (uint l = 0; l < tex_info.m_levels; l++)
      faces[f][l] = crnlib_new<mip_level>();
  }

  const uint tex_num_blocks_x = (tex_info.m_width + 3) >> 2;
  const uint tex_num_blocks_y = (tex_info.m_height + 3) >> 2;

  vector<uint8> dxt_data;
  // Create temp buffer big enough to hold the largest mip level, and all faces if it's a cubemap.
  dxt_data.resize(tex_info.m_bytes_per_block * tex_num_blocks_x * tex_num_blocks_y * tex_info.m_faces);

  set_last_error("CRN unpack failed");

#if 0
      timer t;
      double total_time = 0.0f;
      t.start();
#endif

  crnd::crnd_unpack_context pContext = crnd::crnd_unpack_begin(pData, data_size);

#if 0
      total_time += t.get_elapsed_secs();
#endif

  if (!pContext) {
    for (uint f = 0; f < faces.size(); f++)
      for (uint l = 0; l < faces[f].size(); l++)
        crnlib_delete(faces[f][l]);
    return false;
  }

  uint total_pixels = 0;

  void* pFaces[cCRNMaxFaces];
  for (uint f = tex_info.m_faces; f < cCRNMaxFaces; f++)
    pFaces[f] = nullptr;

  for (uint l = 0; l < tex_info.m_levels; l++) {
    const uint level_width = math::maximum<uint>(1U, tex_info.m_width >> l);
    const uint level_height = math::maximum<uint>(1U, tex_info.m_height >> l);
    const uint num_blocks_x = (level_width + 3U) >> 2U;
    const uint num_blocks_y = (level_height + 3U) >> 2U;

    const uint row_pitch = num_blocks_x * tex_info.m_bytes_per_block;
    const uint size_of_face = num_blocks_y * row_pitch;

    total_pixels += num_blocks_x * num_blocks_y * 4 * 4 * tex_info.m_faces;

#if 0
         t.start();
#endif

    for (uint f = 0; f < tex_info.m_faces; f++)
      pFaces[f] = &dxt_data[f * size_of_face];

    if (!crnd::crnd_unpack_level(pContext, pFaces, dxt_data.size(), row_pitch, l)) {
      crnd::crnd_unpack_end(pContext);
      for (uint f = 0; f < faces.size(); f++)
        for (uint l = 0; l < faces[f].size(); l++)
          crnlib_delete(faces[f][l]);
      return false;
    }

#if 0
         total_time += t.get_elapsed_secs();
#endif

    for (uint f = 0; f < tex_info.m_faces; f++) {
      dxt_image* pDXT_image = crnlib_new<dxt_image>();

      if (!pDXT_image->init(
              dxt_fmt, level_width, level_height,
              num_blocks_x * num_blocks_y * (tex_info.m_bytes_per_block / sizeof(dxt_image::element)),
              reinterpret_cast<dxt_image::element*>(pFaces[f]), true)) {
        crnlib_delete(pDXT_image);

        crnd::crnd_unpack_end(pContext);
        for (uint f = 0; f < faces.size(); f++)
          for (uint l = 0; l < faces[f].size(); l++)
            crnlib_delete(faces[f][l]);

        return false;
      }

      faces[f][l]->assign(pDXT_image, dds_fmt);
    }
  }

#if 0
      if (total_pixels)
      {
         console::info("read_crn_from_memory: Total pixels: %u, ms: %3.3fms, megapixels/sec: %3.3f",
            total_pixels, total_time * 1000.0f, total_pixels / total_time);
      }
#endif

  crnd::crnd_unpack_end(pContext);

  assign(faces);
  set_name(pFilename);

  m_source_file_type = texture_file_types::cFormatCRN;
  clear_last_error();

  return true;
}